

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

enable_if_t<HasSize<vector<pair<basic_string<char>,_TextureSceneEntity>_>_>::value_&&_HasData<vector<pair<basic_string<char>,_TextureSceneEntity>_>_>::value,_std::ostream_&>
 pbrt::detail::operator<<
           (ostream *os,
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
           *v)

{
  ostream *poVar1;
  pointer ppVar2;
  ulong uVar3;
  TextureSceneEntity *in_R8;
  pointer fmt;
  string local_50;
  
  std::operator<<(os,"[ ");
  ppVar2 = (v->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  fmt = ppVar2;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(v->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) / 0x398);
      uVar3 = uVar3 + 1) {
    StringPrintf<std::__cxx11::string_const&,pbrt::TextureSceneEntity_const&>
              (&local_50,(pbrt *)"[ std::pair first: %s second: %s ]",(char *)fmt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fmt->second,
               in_R8);
    std::operator<<(os,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    ppVar2 = (v->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar3 < ((long)(v->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) / 0x398 - 1U) {
      std::operator<<(os,", ");
      ppVar2 = (v->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    fmt = fmt + 1;
  }
  poVar1 = std::operator<<(os," ]");
  return poVar1;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}